

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

void __thiscall
QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::push
          (QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection> *this,
          Intersection *x)

{
  qsizetype *pqVar1;
  quint64 *pqVar2;
  Intersection *pIVar3;
  uint uVar4;
  QPodPoint QVar5;
  quint64 qVar6;
  quint64 qVar7;
  quint64 qVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  bool bVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  Intersection *other;
  
  uVar15 = (this->m_data).siz;
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::reserve
            (&this->m_data,uVar15 + 1);
  pIVar3 = (this->m_data).buffer;
  lVar12 = (this->m_data).siz;
  uVar10 = *(undefined4 *)&x->field_0x34;
  pIVar3[lVar12].rightEdge = x->rightEdge;
  *(undefined4 *)&pIVar3[lVar12].field_0x34 = uVar10;
  QVar5 = (x->intersectionPoint).upperLeft;
  qVar6 = (x->intersectionPoint).xOffset.numerator;
  qVar7 = (x->intersectionPoint).xOffset.denominator;
  qVar8 = (x->intersectionPoint).yOffset.numerator;
  uVar9 = *(undefined8 *)&x->vertex;
  pqVar2 = &pIVar3[lVar12].intersectionPoint.yOffset.denominator;
  *pqVar2 = (x->intersectionPoint).yOffset.denominator;
  pqVar2[1] = uVar9;
  pqVar2 = &pIVar3[lVar12].intersectionPoint.xOffset.denominator;
  *pqVar2 = qVar7;
  pqVar2[1] = qVar8;
  pIVar3[lVar12].intersectionPoint.upperLeft = QVar5;
  pIVar3[lVar12].intersectionPoint.xOffset.numerator = qVar6;
  pqVar1 = &(this->m_data).siz;
  *pqVar1 = *pqVar1 + 1;
  if ((int)uVar15 == 0) {
    lVar12 = 0;
  }
  else {
    do {
      uVar4 = (uint)uVar15;
      uVar13 = (int)((uVar4 - ((int)(uVar4 - 1) >> 0x1f)) + -1) >> 1;
      pIVar3 = (this->m_data).buffer;
      other = pIVar3 + (int)uVar13;
      bVar11 = QIntersectionPoint::operator<(&x->intersectionPoint,&other->intersectionPoint);
      uVar14 = uVar4;
      if (!bVar11) break;
      uVar10 = *(undefined4 *)&other->field_0x34;
      pIVar3[(int)uVar4].rightEdge = other->rightEdge;
      *(undefined4 *)&pIVar3[(int)uVar4].field_0x34 = uVar10;
      QVar5 = (other->intersectionPoint).upperLeft;
      qVar6 = (other->intersectionPoint).xOffset.numerator;
      qVar7 = (other->intersectionPoint).xOffset.denominator;
      qVar8 = (other->intersectionPoint).yOffset.numerator;
      uVar9 = *(undefined8 *)&other->vertex;
      pqVar2 = &pIVar3[(int)uVar4].intersectionPoint.yOffset.denominator;
      *pqVar2 = (other->intersectionPoint).yOffset.denominator;
      pqVar2[1] = uVar9;
      pqVar2 = &pIVar3[(int)uVar4].intersectionPoint.xOffset.denominator;
      *pqVar2 = qVar7;
      pqVar2[1] = qVar8;
      pIVar3[(int)uVar4].intersectionPoint.upperLeft = QVar5;
      pIVar3[(int)uVar4].intersectionPoint.xOffset.numerator = qVar6;
      uVar15 = (ulong)uVar13;
      uVar14 = uVar13;
    } while (2 < uVar4);
    lVar12 = (long)(int)uVar14;
  }
  pIVar3 = (this->m_data).buffer;
  uVar10 = *(undefined4 *)&x->field_0x34;
  pIVar3[lVar12].rightEdge = x->rightEdge;
  *(undefined4 *)&pIVar3[lVar12].field_0x34 = uVar10;
  QVar5 = (x->intersectionPoint).upperLeft;
  qVar6 = (x->intersectionPoint).xOffset.numerator;
  qVar7 = (x->intersectionPoint).xOffset.denominator;
  qVar8 = (x->intersectionPoint).yOffset.numerator;
  uVar9 = *(undefined8 *)&x->vertex;
  pqVar2 = &pIVar3[lVar12].intersectionPoint.yOffset.denominator;
  *pqVar2 = (x->intersectionPoint).yOffset.denominator;
  pqVar2[1] = uVar9;
  pqVar2 = &pIVar3[lVar12].intersectionPoint.xOffset.denominator;
  *pqVar2 = qVar7;
  pqVar2[1] = qVar8;
  pIVar3[lVar12].intersectionPoint.upperLeft = QVar5;
  pIVar3[lVar12].intersectionPoint.xOffset.numerator = qVar6;
  return;
}

Assistant:

void QMaxHeap<T>::push(const T &x)
{
    int current = m_data.size();
    int parent = QMaxHeap::parent(current);
    m_data.add(x);
    while (current != 0 && m_data.at(parent) < x) {
        m_data.at(current) = m_data.at(parent);
        current = parent;
        parent = QMaxHeap::parent(current);
    }
    m_data.at(current) = x;
}